

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

bool __thiscall GEO::Delaunay2d::triangle_is_conflict(Delaunay2d *this,index_t t,double *p)

{
  index_t iVar1;
  uint uVar2;
  uint uVar3;
  double *pdVar4;
  pointer piVar5;
  pointer pdVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  Sign SVar9;
  long lVar10;
  double *pdVar11;
  double *pv [3];
  double *local_38 [3];
  
  uVar2 = t * 3;
  pdVar4 = (this->super_Delaunay).vertices_;
  piVar5 = (this->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = (this->super_Delaunay).vertex_stride_;
  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
    pdVar11 = (double *)0x0;
    if (piVar5[uVar2 + (int)lVar10] != -1) {
      pdVar11 = pdVar4 + iVar1 * piVar5[uVar2 + (int)lVar10];
    }
    local_38[lVar10] = pdVar11;
  }
  lVar10 = 0;
  while( true ) {
    if (lVar10 == 3) {
      if (this->weighted_ == true) {
        pdVar6 = (this->heights_).super_vector<double,_GEO::Memory::aligned_allocator<double,_64>_>.
                 super__Vector_base<double,_GEO::Memory::aligned_allocator<double,_64>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar10 = (long)p - (long)pdVar4;
        auVar7._8_8_ = lVar10 >> 0x3f;
        auVar7._0_8_ = lVar10 >> 3;
        SVar9 = PCK::orient_2dlifted_SOS
                          (local_38[0],local_38[1],local_38[2],p,pdVar6[(uint)piVar5[uVar2]],
                           pdVar6[(uint)piVar5[uVar2 + 1]],pdVar6[(uint)piVar5[uVar2 + 2]],
                           pdVar6[SUB164(auVar7 / SEXT816((long)(int)iVar1),0)]);
      }
      else {
        SVar9 = PCK::in_circle_2d_SOS(local_38[0],local_38[1],local_38[2],p);
      }
      return ZERO < SVar9;
    }
    if (local_38[lVar10] == (double *)0x0) break;
    lVar10 = lVar10 + 1;
  }
  local_38[lVar10] = p;
  SVar9 = PCK::orient_2d(local_38[0],local_38[1],local_38[2]);
  if (ZERO < SVar9) {
    return true;
  }
  if (NEGATIVE < SVar9) {
    uVar2 = (this->cell_to_cell_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
            super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
            super__Vector_impl_data._M_start[uVar2 + (int)lVar10];
    uVar3 = (this->cell_next_).
            super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar2];
    if (-1 < (int)uVar3) {
      return true;
    }
    if (uVar3 != this->cur_stamp_) {
      bVar8 = triangle_is_conflict(this,uVar2,p);
      return bVar8;
    }
  }
  return false;
}

Assistant:

bool triangle_is_conflict(index_t t, const double* p) const {

            // Lookup triangle vertices
            const double* pv[3];
            for(index_t i=0; i<3; ++i) {
                signed_index_t v = triangle_vertex(t,i);
                pv[i] = (v == -1) ? nullptr : vertex_ptr(index_t(v));
            }

            // Check for virtual triangles (then in_circle()
            // is replaced with orient2d())
            for(index_t le = 0; le < 3; ++le) {

                if(pv[le] == nullptr) {

                    // Facet of a virtual triangle opposite to
                    // infinite vertex corresponds to
                    // the triangle on the convex hull of the points.
                    // Orientation is obtained by replacing vertex lf
                    // with p.
                    pv[le] = p;
                    Sign sign = PCK::orient_2d(pv[0],pv[1],pv[2]);

                    if(sign > 0) {
                        return true;
                    }

                    if(sign < 0) {
                        return false;
                    }

                    // If sign is zero, we check the real triangle
                    // adjacent to the facet on the convex hull.
                    geo_debug_assert(triangle_adjacent(t, le) >= 0);
                    index_t t2 = index_t(triangle_adjacent(t, le));
                    geo_debug_assert(!triangle_is_virtual(t2));

                    //  If t2 is already chained in the conflict list,
                    // then it is conflict
                    if(triangle_is_in_list(t2)) {
                        return true;
                    }

                    //  If t2 is marked, then it is not in conflict.
                    if(triangle_is_marked(t2)) {
                        return false;
                    }

                    return triangle_is_conflict(t2, p);
                }
            }

            //   If the triangle is a finite one, it is in conflict
            // if its circumscribed sphere contains the point (this is
            // the standard case).

            if(weighted_) {
                double h0 = heights_[finite_triangle_vertex(t, 0)];
                double h1 = heights_[finite_triangle_vertex(t, 1)];
                double h2 = heights_[finite_triangle_vertex(t, 2)];
                index_t pindex = index_t(
                    (p - vertex_ptr(0)) / int(vertex_stride_)
                );
                double h = heights_[pindex];
                return (PCK::orient_2dlifted_SOS(
                            pv[0],pv[1],pv[2],p,h0,h1,h2,h
                       ) > 0) ;
            }

            return (PCK::in_circle_2d_SOS(pv[0], pv[1], pv[2], p) > 0);
        }